

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void ar_predict(ar_object obj,double *inp,int L,double *xpred,double *amse)

{
  double dVar1;
  uint N;
  uint ip;
  undefined8 *__ptr;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  N = obj->N;
  ip = obj->p;
  __ptr = (undefined8 *)malloc(8);
  W = (double *)malloc((long)(int)N << 3);
  resid = (double *)malloc((long)(int)N << 3);
  uVar4 = 1;
  if (1 < (int)ip) {
    uVar4 = (ulong)ip;
  }
  phi = (double *)malloc(uVar4 * 8);
  theta = (double *)malloc(uVar4 * 8);
  *__ptr = 0x3ff0000000000000;
  dVar1 = obj->mean;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)N) {
    uVar2 = (ulong)N;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    W[uVar3] = inp[uVar3] - dVar1;
    resid[uVar3] = obj->res[uVar3];
  }
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    theta[uVar2] = 0.0;
    phi[uVar2] = 0.0;
  }
  uVar2 = 0;
  uVar4 = 0;
  if (0 < (int)ip) {
    uVar4 = (ulong)ip;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    phi[uVar2] = obj->phi[uVar2];
  }
  uVar2 = 0;
  forkal(ip,0,0,phi,theta,(double *)(__ptr + 1),N,W,resid,L,xpred,amse);
  uVar4 = (ulong)(uint)L;
  if (L < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    xpred[uVar2] = xpred[uVar2] + dVar1;
  }
  free(__ptr);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void ar_predict(ar_object obj, double *inp, int L, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir;
	double *delta, *W, *resid, *phi, *theta;
	double wmean;

	d = 0;
	N = obj->N;
	ip = obj->p;
	iq = 0;
	delta = (double*)malloc(sizeof(double)* (d + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	if (d > 0) {
		deld(d, delta);
	}
	else {
		*delta = 1.0;
		wmean = obj->mean;
	}
	for (i = 1; i <= d; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < ip; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = -1.0 *  0.0;
	}

	forkal(ip, iq, d, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}